

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

bool __thiscall draco::PointAttribute::Reset(PointAttribute *this,size_t num_attribute_values)

{
  bool bVar1;
  DataType dt;
  int32_t iVar2;
  undefined4 in_ESI;
  GeometryAttribute *in_RDI;
  int64_t entry_size;
  pointer in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  DataBuffer *in_stack_ffffffffffffffb8;
  
  bVar1 = std::operator==((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
  if (bVar1) {
    in_stack_ffffffffffffffb8 = (DataBuffer *)operator_new(0x28);
    DataBuffer::DataBuffer((DataBuffer *)in_RDI);
    std::unique_ptr<draco::DataBuffer,std::default_delete<draco::DataBuffer>>::
    unique_ptr<std::default_delete<draco::DataBuffer>,void>
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::operator=
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               in_stack_ffffffffffffffa8);
    std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::~unique_ptr
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)in_RDI);
  }
  dt = GeometryAttribute::data_type(in_RDI);
  iVar2 = DataTypeLength(dt);
  GeometryAttribute::num_components(in_RDI);
  std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::operator->
            ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)0x1cc1c7);
  bVar1 = DataBuffer::Update((DataBuffer *)in_RDI,in_stack_ffffffffffffffb8,
                             CONCAT44(iVar2,in_stack_ffffffffffffffb0));
  if (bVar1) {
    std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::get
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffb0));
    GeometryAttribute::ResetBuffer
              (in_RDI,in_stack_ffffffffffffffb8,CONCAT44(iVar2,in_stack_ffffffffffffffb0),
               (int64_t)in_stack_ffffffffffffffa8);
    *(undefined4 *)&in_RDI[1].normalized_ = in_ESI;
  }
  return bVar1;
}

Assistant:

bool PointAttribute::Reset(size_t num_attribute_values) {
  if (attribute_buffer_ == nullptr) {
    attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
  }
  const int64_t entry_size = DataTypeLength(data_type()) * num_components();
  if (!attribute_buffer_->Update(nullptr, num_attribute_values * entry_size)) {
    return false;
  }
  // Assign the new buffer to the parent attribute.
  ResetBuffer(attribute_buffer_.get(), entry_size, 0);
  num_unique_entries_ = static_cast<uint32_t>(num_attribute_values);
  return true;
}